

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O3

void print_out(string *_str,int _x,int _y)

{
  pointer pbVar1;
  pointer pbVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  size_t i;
  ulong uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  uVar7 = 0;
  vera::split(&local_48,_str,'\n',false);
  if (out_win == (WINDOW *)0x0) {
    uVar10 = 0xfffffffffffffffd;
  }
  else {
    uVar10 = (long)out_win->_maxy - 1;
  }
  uVar3 = (long)local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  uVar4 = uVar3 - uVar10;
  iVar9 = 0;
  if (uVar10 <= uVar3 && uVar4 != 0) {
    iVar9 = (int)uVar4;
  }
  if (0 < out_offset_line) {
    uVar7 = (ulong)(uint)out_offset_line;
  }
  uVar5 = uVar7;
  if (uVar4 <= uVar7) {
    uVar5 = uVar4 & 0xffffffff;
  }
  if ((out_offset_line < 0) || (uVar4 <= uVar7)) {
    out_offset_line = (int)uVar5;
  }
  uVar6 = iVar9 - (int)uVar5;
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  uVar7 = (ulong)uVar6;
  if (uVar7 < uVar3) {
    lVar8 = uVar7 << 5;
    iVar9 = 0;
    pbVar1 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if ((ulong)(long)iVar9 < uVar10) {
        mvwprintw(out_win,iVar9 + _y,_x,"%s",
                  *(undefined8 *)((long)&(pbVar1->_M_dataplus)._M_p + lVar8));
        iVar9 = iVar9 + 1;
        pbVar1 = local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar2 = local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x20;
    } while (uVar7 < (ulong)((long)pbVar2 - (long)pbVar1 >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void print_out(const std::string& _str, int _x, int _y) {
    std::vector<std::string> lines = vera::split(_str, '\n');
    size_t total_lines, total_cols;
    getmaxyx(out_win, total_lines, total_cols);
    total_lines -= 2;

    int line_n = 0;

    if (lines.size() > total_lines)
        line_n = lines.size() - total_lines;
    
    if (out_offset_line < 0)
        out_offset_line = 0;

    if (out_offset_line >= lines.size()-total_lines)
        out_offset_line = lines.size()-total_lines;

    line_n -= out_offset_line;
    if (line_n < 0)
        line_n = 0;

    int y = 0;
    for (size_t i = line_n; i < lines.size(); i++) {
        if (y < total_lines)
            mvwprintw(out_win, _y + y++, _x, "%s", lines[i].c_str() );
    }
}